

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O3

int __thiscall dic::dictCreate(dic *this)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  pointer __s;
  value_type vStack_68;
  
  vStack_68.rehashidx = -1;
  vStack_68.ht[0].table = (dictEntry **)operator_new__(0x400);
  vStack_68.ht[0].size = 0x80;
  vStack_68.ht[0].sizemask = 0x7f;
  vStack_68.ht[0].used = 0;
  vStack_68.ht[1].size = 0;
  vStack_68.ht[1].sizemask = 0xffffffffffffffff;
  vStack_68.ht[1].used = 0;
  std::vector<dict,_std::allocator<dict>_>::push_back(&this->dc,&vStack_68);
  __s = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.super__Vector_impl_data.
        _M_finish;
  sVar2 = strlen((char *)__s);
  uVar4 = (uint)sVar2;
  uVar3 = uVar4 * 0xabcd;
  if (3 < (int)uVar4) {
    do {
      uVar4 = *(int *)&__s->type * 0x5bd1e995;
      uVar3 = uVar3 * 0x5bd1e995 ^ (uVar4 >> 0x18 ^ uVar4) * 0x5bd1e995;
      __s = (pointer)((long)&__s->type + 4);
      uVar1 = (uint)sVar2;
      uVar4 = uVar1 - 4;
      sVar2 = (size_t)uVar4;
    } while (7 < uVar1);
  }
  if (uVar4 != 1) {
    if (uVar4 != 2) {
      if (uVar4 != 3) goto LAB_00106adb;
      uVar3 = uVar3 ^ (int)*(char *)((long)&__s->type + 2) << 0x10;
    }
    uVar3 = uVar3 ^ (int)*(char *)((long)&__s->type + 1) << 8;
  }
  uVar3 = ((int)*(char *)&__s->type ^ uVar3) * 0x5bd1e995;
LAB_00106adb:
  uVar4 = (uVar3 >> 0xd ^ uVar3) * 0x5bd1e995;
  return uVar4 >> 0xf ^ uVar4;
}

Assistant:

int dic::dictCreate(){
    dict dt;
    dt.rehashidx=-1;
    dictht dct1,dct2;
    dct1.size=INITSIZE;
    dct1.sizemask=dct1.size-1;
    dct1.used=0;
    dct1.table=new dictEntry*[dct1.size];
    dct2.size=0;
    dct2.sizemask=-1;
    dct2.used=0;
    dt.ht[0]=dct1;
    dt.ht[1]=dct2;
    dc.push_back(dt);
    //return dc.end()-1-dc.begin();
}